

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Spc_File::load_(Spc_File *this,Data_Reader *in)

{
  long lVar1;
  blargg_err_t pcVar2;
  uchar *puVar3;
  size_t sVar4;
  long *in_RSI;
  long in_RDI;
  blargg_err_t blargg_return_err__4;
  blargg_err_t blargg_return_err__3;
  blargg_err_t blargg_return_err__2;
  long xid6_size;
  long xid6_offset;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  long file_size;
  void *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  blargg_vector<unsigned_char> *in_stack_ffffffffffffff98;
  blargg_err_t local_8;
  
  lVar1 = (**(code **)(*in_RSI + 0x20))();
  if (lVar1 < 0x10180) {
    local_8 = "Wrong file type for this emulator";
  }
  else {
    local_8 = (blargg_err_t)(**(code **)(*in_RSI + 0x18))(in_RSI,in_RDI + 0x1a0,0x100);
    if ((local_8 == (blargg_err_t)0x0) &&
       (local_8 = check_spc_header(in_stack_ffffffffffffff88), local_8 == (blargg_err_t)0x0)) {
      if (0 < lVar1 + -0x10200) {
        pcVar2 = blargg_vector<unsigned_char>::resize
                           (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
        pcVar2 = (blargg_err_t)(**(code **)(*in_RSI + 0x28))(in_RSI,0x10100);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
        puVar3 = blargg_vector<unsigned_char>::begin
                           ((blargg_vector<unsigned_char> *)(in_RDI + 0x2a0));
        sVar4 = blargg_vector<unsigned_char>::size((blargg_vector<unsigned_char> *)(in_RDI + 0x2a0))
        ;
        pcVar2 = (blargg_err_t)(**(code **)(*in_RSI + 0x18))(in_RSI,puVar3,sVar4);
        if (pcVar2 != (blargg_err_t)0x0) {
          return pcVar2;
        }
      }
      local_8 = (blargg_err_t)0x0;
    }
  }
  return local_8;
}

Assistant:

blargg_err_t load_( Data_Reader& in )
	{
		long file_size = in.remain();
		if ( file_size < Snes_Spc::spc_min_file_size )
			return gme_wrong_file_type;
		RETURN_ERR( in.read( &header, Spc_Emu::header_size ) );
		RETURN_ERR( check_spc_header( header.tag ) );
		long const xid6_offset = 0x10200;
		long xid6_size = file_size - xid6_offset;
		if ( xid6_size > 0 )
		{
			RETURN_ERR( xid6.resize( xid6_size ) );
			RETURN_ERR( in.skip( xid6_offset - Spc_Emu::header_size ) );
			RETURN_ERR( in.read( xid6.begin(), (long)xid6.size() ) );
		}
		return 0;
	}